

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void __thiscall jpgd::jpeg_decoder::decode_next_row(jpeg_decoder *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int local_80;
  uint local_7c;
  int local_78;
  int local_74;
  int local_64;
  int local_60;
  int kt_2;
  int kt_1;
  int n_1;
  int kt;
  int n;
  int extra_bits;
  int k;
  huff_tables *pH;
  uint local_38;
  int prev_num_set;
  int s;
  int r;
  jpgd_quant_t *q;
  int component_id;
  int mcu_block;
  jpgd_block_t *p;
  int mcu_row;
  int row_block;
  jpeg_decoder *this_local;
  
  p._4_4_ = 0;
  p._0_4_ = 0;
  _mcu_row = this;
  do {
    if (this->m_mcus_per_row <= (int)p) {
      return;
    }
    if ((this->m_restart_interval != 0) && (this->m_restarts_left == 0)) {
      process_restart(this);
    }
    _component_id = this->m_pMCU_coefficients;
    for (q._4_4_ = 0; q._4_4_ < this->m_blocks_per_mcu; q._4_4_ = q._4_4_ + 1) {
      q._0_4_ = this->m_mcu_org[q._4_4_];
      _s = this->m_quant[this->m_comp_quant[(int)q]];
      uVar2 = huff_decode(this,this->m_pHuff_tabs[this->m_comp_dc_tab[(int)q]],&prev_num_set);
      if (prev_num_set < *(int *)(s_extend_test + (long)(int)(uVar2 & 0xf) * 4)) {
        local_74 = prev_num_set + *(int *)(s_extend_offset + (long)(int)(uVar2 & 0xf) * 4);
      }
      else {
        local_74 = prev_num_set;
      }
      local_38 = this->m_last_dc_val[(int)q] + local_74;
      this->m_last_dc_val[(int)q] = local_38;
      *_component_id = (short)local_38 * *_s;
      pH._4_4_ = this->m_mcu_block_max_zag[q._4_4_];
      _extra_bits = this->m_pHuff_tabs[this->m_comp_ac_tab[(int)q]];
      for (n = 1; uVar1 = local_38, n < 0x40; n = n + 1) {
        local_38 = huff_decode(this,_extra_bits,&kt);
        prev_num_set = (int)local_38 >> 4;
        local_38 = local_38 & 0xf;
        if (local_38 == 0) {
          uVar1 = 0;
          if (prev_num_set != 0xf) break;
          if (0x40 < n + 0x10) {
            stop_decoding(this,JPGD_DECODE_ERROR);
          }
          if (n < pH._4_4_) {
            if (pH._4_4_ - n < 0x11) {
              local_80 = pH._4_4_ - n;
            }
            else {
              local_80 = 0x10;
            }
            kt_2 = local_80;
            local_60 = n;
            while (kt_2 != 0) {
              if (0x3f < local_60) {
                __assert_fail("kt <= 63",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/shuai132[P]usbcam/jpgd.cpp"
                              ,0x729,"void jpgd::jpeg_decoder::decode_next_row()");
              }
              _component_id[*(int *)(g_ZAG + (long)local_60 * 4)] = 0;
              local_60 = local_60 + 1;
              kt_2 = kt_2 + -1;
            }
          }
          n = n + 0xf;
          if (_component_id[*(int *)(g_ZAG + (long)n * 4)] != 0) {
            __assert_fail("p[g_ZAG[k]] == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/shuai132[P]usbcam/jpgd.cpp"
                          ,0x72f,"void jpgd::jpeg_decoder::decode_next_row()");
          }
        }
        else {
          if (prev_num_set != 0) {
            if (0x3f < n + prev_num_set) {
              stop_decoding(this,JPGD_DECODE_ERROR);
            }
            if (n < pH._4_4_) {
              local_78 = prev_num_set;
              if (pH._4_4_ - n <= prev_num_set) {
                local_78 = pH._4_4_ - n;
              }
              n_1 = local_78;
              kt_1 = n;
              while (n_1 != 0) {
                _component_id[*(int *)(g_ZAG + (long)kt_1 * 4)] = 0;
                kt_1 = kt_1 + 1;
                n_1 = n_1 + -1;
              }
            }
            n = prev_num_set + n;
          }
          if (kt < *(int *)(s_extend_test + (long)(int)local_38 * 4)) {
            local_7c = kt + *(int *)(s_extend_offset + (long)(int)local_38 * 4);
          }
          else {
            local_7c = kt;
          }
          local_38 = local_7c;
          if (0x3f < n) {
            __assert_fail("k < 64",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/shuai132[P]usbcam/jpgd.cpp"
                          ,0x718,"void jpgd::jpeg_decoder::decode_next_row()");
          }
          iVar3 = dequantize_ac(local_7c,(int)_s[n]);
          _component_id[*(int *)(g_ZAG + (long)n * 4)] = (short)iVar3;
          uVar1 = local_38;
        }
        local_38 = uVar1;
      }
      local_38 = uVar1;
      if (n < pH._4_4_) {
        local_64 = n;
        while (local_64 < pH._4_4_) {
          _component_id[*(int *)(g_ZAG + (long)local_64 * 4)] = 0;
          local_64 = local_64 + 1;
        }
      }
      this->m_mcu_block_max_zag[q._4_4_] = n;
      p._4_4_ = p._4_4_ + 1;
      _component_id = _component_id + 0x40;
    }
    if ((this->m_freq_domain_chroma_upsample & 1U) == 0) {
      transform_mcu(this,(int)p);
    }
    else {
      transform_mcu_expand(this,(int)p);
    }
    this->m_restarts_left = this->m_restarts_left + -1;
    p._0_4_ = (int)p + 1;
  } while( true );
}

Assistant:

void jpeg_decoder::decode_next_row()
{
  int row_block = 0;

  for (int mcu_row = 0; mcu_row < m_mcus_per_row; mcu_row++)
  {
    if ((m_restart_interval) && (m_restarts_left == 0))
      process_restart();

    jpgd_block_t* p = m_pMCU_coefficients;
    for (int mcu_block = 0; mcu_block < m_blocks_per_mcu; mcu_block++, p += 64)
    {
      int component_id = m_mcu_org[mcu_block];
      jpgd_quant_t* q = m_quant[m_comp_quant[component_id]];

      int r, s;
      s = huff_decode(m_pHuff_tabs[m_comp_dc_tab[component_id]], r);
      s = JPGD_HUFF_EXTEND(r, s);

      m_last_dc_val[component_id] = (s += m_last_dc_val[component_id]);

      p[0] = static_cast<jpgd_block_t>(s * q[0]);

      int prev_num_set = m_mcu_block_max_zag[mcu_block];

      huff_tables *pH = m_pHuff_tabs[m_comp_ac_tab[component_id]];

      int k;
      for (k = 1; k < 64; k++)
      {
        int extra_bits;
        s = huff_decode(pH, extra_bits);

        r = s >> 4;
        s &= 15;

        if (s)
        {
          if (r)
          {
            if ((k + r) > 63)
              stop_decoding(JPGD_DECODE_ERROR);

            if (k < prev_num_set)
            {
              int n = JPGD_MIN(r, prev_num_set - k);
              int kt = k;
              while (n--)
                p[g_ZAG[kt++]] = 0;
            }

            k += r;
          }
          
          s = JPGD_HUFF_EXTEND(extra_bits, s);

          JPGD_ASSERT(k < 64);

          p[g_ZAG[k]] = static_cast<jpgd_block_t>(dequantize_ac(s, q[k])); //s * q[k];
        }
        else
        {
          if (r == 15)
          {
            if ((k + 16) > 64)
              stop_decoding(JPGD_DECODE_ERROR);

            if (k < prev_num_set)
            {
              int n = JPGD_MIN(16, prev_num_set - k);
              int kt = k;
              while (n--)
              {
                JPGD_ASSERT(kt <= 63);
                p[g_ZAG[kt++]] = 0;
              }
            }

            k += 16 - 1; // - 1 because the loop counter is k
            JPGD_ASSERT(p[g_ZAG[k]] == 0);
          }
          else
            break;
        }
      }

      if (k < prev_num_set)
      {
        int kt = k;
        while (kt < prev_num_set)
          p[g_ZAG[kt++]] = 0;
      }

      m_mcu_block_max_zag[mcu_block] = k;

      row_block++;
    }

    if (m_freq_domain_chroma_upsample)
      transform_mcu_expand(mcu_row);
    else
      transform_mcu(mcu_row);

    m_restarts_left--;
  }
}